

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall
MemoryArrayReader::MemoryArrayReader(MemoryArrayReader *this,char *buffer,long length)

{
  (this->super_FileReader).StartPos = 0;
  (this->super_FileReader).FilePos = 0;
  (this->super_FileReader).File = (FILE *)0x0;
  (this->super_FileReader).Length = 0;
  (this->super_FileReader).CloseOnDestruct = false;
  (this->super_FileReader).super_FileReaderBase._vptr_FileReaderBase =
       (_func_int **)&PTR__MemoryArrayReader_006ef230;
  (this->buf).Array = (uchar *)0x0;
  (this->buf).Most = 0;
  (this->buf).Count = 0;
  TArray<unsigned_char,_unsigned_char>::Resize(&this->buf,(uint)length);
  memcpy((this->buf).Array,buffer,length);
  (this->super_FileReader).Length = length;
  (this->super_FileReader).FilePos = 0;
  return;
}

Assistant:

MemoryArrayReader::MemoryArrayReader (const char *buffer, long length)
{
    buf.Resize(length);
    memcpy(&buf[0], buffer, length);
    Length=length;
    FilePos=0;
}